

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QSize __thiscall QMdiSubWindow::minimumSizeHint(QMdiSubWindow *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  QObject *pQVar4;
  QLayout *pQVar5;
  QWidget *pQVar6;
  QStyle *pQVar7;
  int *piVar8;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int sizeGripHeight;
  int decorationHeight;
  QMdiSubWindowPrivate *d;
  QSize minBaseWidgetSize;
  QSize minLayoutSize;
  int minHeight;
  int minWidth;
  int margin;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QSize *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_3c;
  int local_38;
  undefined1 *local_34;
  int local_2c;
  undefined1 *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  this_00 = d_func((QMdiSubWindow *)0x63750a);
  bVar1 = QWidget::isVisible((QWidget *)0x637519);
  if (bVar1) {
    QWidget::ensurePolished(pQVar6);
  }
  pQVar4 = QObject::parent((QObject *)0x637533);
  if (((pQVar4 != (QObject *)0x0) && (bVar1 = QWidget::isMinimized(in_RDI), bVar1)) &&
     (bVar1 = isShaded((QMdiSubWindow *)0x637553), !bVar1)) {
    local_10 = QMdiSubWindowPrivate::iconSize
                         ((QMdiSubWindowPrivate *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    goto LAB_0063784f;
  }
  local_14 = -0x55555556;
  local_18 = -0x55555556;
  QMdiSubWindowPrivate::sizeParameters
            (this_00,(int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (int *)in_RDI);
  iVar3 = local_14;
  iVar2 = QMdiSubWindowPrivate::titleBarHeight
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar3 = iVar3 + iVar2;
  local_1c = iVar3;
  pQVar4 = QObject::parent((QObject *)0x6375bf);
  if ((pQVar4 != (QObject *)0x0) && (bVar1 = isShaded((QMdiSubWindow *)0x6375cf), bVar1)) {
    local_20 = QWidget::width((QWidget *)0x6375df);
    qMax<int>(&local_18,&local_20);
    QMdiSubWindowPrivate::titleBarHeight
              ((QMdiSubWindowPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
    QSize::QSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    goto LAB_0063784f;
  }
  pQVar5 = QWidget::layout((QWidget *)0x637621);
  if (pQVar5 == (QLayout *)0x0) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x6376b1);
    if (bVar1) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6376cb);
      bVar1 = QWidget::isVisible((QWidget *)0x6376d3);
      if (bVar1) {
        local_34 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6376f6);
        local_34 = (undefined1 *)(**(code **)(*(long *)pQVar6 + 0x78))();
        bVar1 = QSize::isValid((QSize *)in_RDI);
        if (bVar1) {
          local_38 = QSize::width((QSize *)0x63771e);
          local_38 = local_38 + local_14 * 2;
          piVar8 = qMax<int>(&local_18,&local_38);
          local_18 = *piVar8;
          iVar2 = QSize::height((QSize *)0x637749);
          local_1c = iVar2 + local_1c;
        }
      }
    }
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QWidget::layout((QWidget *)0x63763d);
    local_28 = (undefined1 *)(**(code **)(*(long *)pQVar5 + 0x90))();
    bVar1 = QSize::isValid((QSize *)in_RDI);
    if (bVar1) {
      local_2c = QSize::width((QSize *)0x637668);
      local_2c = local_2c + local_14 * 2;
      piVar8 = qMax<int>(&local_18,&local_2c);
      local_18 = *piVar8;
      iVar2 = QSize::height((QSize *)0x637693);
      local_1c = iVar2 + local_1c;
    }
  }
  iVar2 = 0;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x63776e);
  if (bVar1) {
    QPointer<QSizeGrip>::operator->((QPointer<QSizeGrip> *)0x637785);
    bVar1 = QWidget::isVisibleTo((QWidget *)CONCAT44(iVar3,iVar2),in_RDI);
    if (!bVar1) goto LAB_006377b7;
    QPointer<QSizeGrip>::operator->((QPointer<QSizeGrip> *)0x6377a9);
    iVar2 = QWidget::height((QWidget *)0x6377b1);
  }
  else {
LAB_006377b7:
    pQVar4 = QObject::parent((QObject *)0x6377c1);
    if (pQVar4 != (QObject *)0x0) {
      QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      bVar1 = isMacStyle((QStyle *)in_RDI);
      if ((bVar1) &&
         (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x6377f0), !bVar1)) {
        pQVar7 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        iVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x45,0,in_RDI);
      }
    }
  }
  local_3c = iVar3 + iVar2;
  piVar8 = qMax<int>(&local_1c,&local_3c);
  local_1c = *piVar8;
  QSize::QSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
LAB_0063784f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QMdiSubWindow::minimumSizeHint() const
{
    Q_D(const QMdiSubWindow);
    if (isVisible())
        ensurePolished();

    // Minimized window.
    if (parent() && isMinimized() && !isShaded())
        return d->iconSize();

    // Calculate window decoration.
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    int decorationHeight = margin + d->titleBarHeight();
    int minHeight = decorationHeight;

    // Shaded window.
    if (parent() && isShaded())
        return QSize(qMax(minWidth, width()), d->titleBarHeight());

    // Content
    if (layout()) {
        QSize minLayoutSize = layout()->minimumSize();
        if (minLayoutSize.isValid()) {
            minWidth = qMax(minWidth, minLayoutSize.width() + 2 * margin);
            minHeight += minLayoutSize.height();
        }
    } else if (d->baseWidget && d->baseWidget->isVisible()) {
        QSize minBaseWidgetSize = d->baseWidget->minimumSizeHint();
        if (minBaseWidgetSize.isValid()) {
            minWidth = qMax(minWidth, minBaseWidgetSize.width() + 2 * margin);
            minHeight += minBaseWidgetSize.height();
        }
    }

#if QT_CONFIG(sizegrip)
    // SizeGrip
    int sizeGripHeight = 0;
    if (d->sizeGrip && d->sizeGrip->isVisibleTo(const_cast<QMdiSubWindow *>(this)))
        sizeGripHeight = d->sizeGrip->height();
    else if (parent() && isMacStyle(style()) && !d->sizeGrip)
        sizeGripHeight = style()->pixelMetric(QStyle::PM_SizeGripSize, nullptr, this);
    minHeight = qMax(minHeight, decorationHeight + sizeGripHeight);
#endif

    return QSize(minWidth, minHeight);
}